

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::set_sizes<char,false,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *node,
          uint32_t shift)

{
  internal_node<char,_false> *piVar1;
  uint32_t uVar2;
  internal_node<char,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  uint32_t uVar5;
  ulong uVar6;
  ref<immutable::rrb_details::rrb_size_table<false>_> table;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_48;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_40;
  internal_node<char,_false> *local_38;
  
  local_38 = (internal_node<char,_false> *)this;
  piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
  local_48.ptr = size_table_create<false>(piVar3->len);
  if (local_48.ptr != (rrb_size_table<false> *)0x0) {
    (local_48.ptr)->_ref_count = 1;
  }
  uVar6 = 0;
  uVar5 = 0;
  while( true ) {
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
    if (piVar3->len <= uVar6) break;
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
    local_40.ptr = (tree_node<char,_false> *)piVar3->child[uVar6].ptr;
    if ((internal_node<char,_false> *)local_40.ptr != (internal_node<char,_false> *)0x0) {
      ((internal_node<char,_false> *)local_40.ptr)->_ref_count =
           ((internal_node<char,_false> *)local_40.ptr)->_ref_count + 1;
    }
    uVar2 = size_sub_trie<char,false,5>(&local_40,shift - 5);
    uVar5 = uVar5 + uVar2;
    prVar4 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&local_48);
    prVar4->size[uVar6] = uVar5;
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_40);
    uVar6 = uVar6 + 1;
  }
  piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
  ref<immutable::rrb_details::rrb_size_table<false>_>::operator=(&piVar3->size_table,&local_48);
  piVar1 = local_38;
  piVar3 = node->ptr;
  *(internal_node<char,_false> **)local_38 = piVar3;
  if (piVar3 != (internal_node<char,_false> *)0x0) {
    piVar3->_ref_count = piVar3->_ref_count + 1;
  }
  release(local_48.ptr);
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)piVar1;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> set_sizes(ref<internal_node<T, atomic_ref_counting>>& node, uint32_t shift)
      {
      uint32_t sum = 0;
      ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(node->len);
      const uint32_t child_shift = shift - bits<N>::rrb_bits;

      for (uint32_t i = 0; i < node->len; i++)
        {
        ref<tree_node<T, atomic_ref_counting>> child = node->child[i];
        sum += size_sub_trie<T, atomic_ref_counting, N>(child, child_shift);
        table->size[i] = sum;
        }
      node->size_table = table;
      return node;
      }